

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O2

size_t __thiscall c4::yml::Tree::add_tag_directive(Tree *this,TagDirective *td)

{
  csubstr *pcVar1;
  pfn_error p_Var2;
  code *pcVar3;
  char *pcVar4;
  size_t sVar5;
  size_t sVar6;
  Location LVar7;
  Location LVar8;
  Location LVar9;
  Location LVar10;
  Location LVar11;
  Location LVar12;
  bool bVar13;
  int iVar14;
  size_t sVar15;
  ro_substr chars;
  csubstr cVar16;
  char *pcStack_1a0;
  size_t local_198;
  char *pcStack_178;
  size_t local_170;
  char *pcStack_150;
  size_t local_148;
  char *pcStack_128;
  size_t local_120;
  char *pcStack_100;
  size_t local_f8;
  char *pcStack_d8;
  size_t local_d0;
  char msg [33];
  
  if (((td->handle).len == 0) || ((td->handle).str == (char *)0x0)) {
    builtin_strncpy(msg + 0x10,"d.handle.empty()",0x11);
    builtin_strncpy(msg,"check failed: !t",0x10);
    if (((byte)s_error_flags & 1) != 0) {
      bVar13 = is_debugger_attached();
      if (bVar13) {
        pcVar3 = (code *)swi(3);
        sVar15 = (*pcVar3)();
        return sVar15;
      }
    }
    p_Var2 = (this->m_callbacks).m_error;
    cVar16 = to_csubstr(
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                       );
    local_d0 = cVar16.len;
    pcStack_d8 = cVar16.str;
    LVar7.super_LineCol.col = 0;
    LVar7.super_LineCol.offset = SUB168(ZEXT816(0x6814) << 0x40,0);
    LVar7.super_LineCol.line = SUB168(ZEXT816(0x6814) << 0x40,8);
    LVar7.name.str = pcStack_d8;
    LVar7.name.len = local_d0;
    (*p_Var2)(msg,0x21,LVar7,(this->m_callbacks).m_user_data);
  }
  if (((td->prefix).len == 0) || ((td->prefix).str == (char *)0x0)) {
    builtin_strncpy(msg + 0x10,"d.prefix.empty()",0x11);
    builtin_strncpy(msg,"check failed: !t",0x10);
    if (((byte)s_error_flags & 1) != 0) {
      bVar13 = is_debugger_attached();
      if (bVar13) {
        pcVar3 = (code *)swi(3);
        sVar15 = (*pcVar3)();
        return sVar15;
      }
    }
    p_Var2 = (this->m_callbacks).m_error;
    cVar16 = to_csubstr(
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                       );
    local_f8 = cVar16.len;
    pcStack_100 = cVar16.str;
    LVar8.super_LineCol.col = 0;
    LVar8.super_LineCol.offset = SUB168(ZEXT816(0x6815) << 0x40,0);
    LVar8.super_LineCol.line = SUB168(ZEXT816(0x6815) << 0x40,8);
    LVar8.name.str = pcStack_100;
    LVar8.name.len = local_f8;
    (*p_Var2)(msg,0x21,LVar8,(this->m_callbacks).m_user_data);
  }
  sVar15 = (td->handle).len;
  if ((sVar15 == 0) || (*(td->handle).str != '!')) {
    builtin_strncpy(msg + 0x10,"d.handle.begins_w",0x11);
    builtin_strncpy(msg,"check failed: (t",0x10);
    if (((byte)s_error_flags & 1) != 0) {
      bVar13 = is_debugger_attached();
      if (bVar13) {
        pcVar3 = (code *)swi(3);
        sVar15 = (*pcVar3)();
        return sVar15;
      }
    }
    p_Var2 = (this->m_callbacks).m_error;
    cVar16 = to_csubstr(
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                       );
    local_120 = cVar16.len;
    pcStack_128 = cVar16.str;
    LVar9.super_LineCol.col = 0;
    LVar9.super_LineCol.offset = SUB168(ZEXT816(0x6816) << 0x40,0);
    LVar9.super_LineCol.line = SUB168(ZEXT816(0x6816) << 0x40,8);
    LVar9.name.str = pcStack_128;
    LVar9.name.len = local_120;
    (*p_Var2)(msg,0x2b,LVar9,(this->m_callbacks).m_user_data);
    sVar15 = (td->handle).len;
    if (sVar15 != 0) goto LAB_001bb7df;
  }
  else {
LAB_001bb7df:
    if ((td->handle).str[sVar15 - 1] == '!') goto LAB_001bb8a3;
  }
  builtin_strncpy(msg + 0x10,"d.handle.ends_wit",0x11);
  builtin_strncpy(msg,"check failed: (t",0x10);
  if (((byte)s_error_flags & 1) != 0) {
    bVar13 = is_debugger_attached();
    if (bVar13) {
      pcVar3 = (code *)swi(3);
      sVar15 = (*pcVar3)();
      return sVar15;
    }
  }
  p_Var2 = (this->m_callbacks).m_error;
  cVar16 = to_csubstr(
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                     );
  local_148 = cVar16.len;
  pcStack_150 = cVar16.str;
  LVar10.super_LineCol.col = 0;
  LVar10.super_LineCol.offset = SUB168(ZEXT816(0x6817) << 0x40,0);
  LVar10.super_LineCol.line = SUB168(ZEXT816(0x6817) << 0x40,8);
  LVar10.name.str = pcStack_150;
  LVar10.name.len = local_148;
  (*p_Var2)(msg,0x29,LVar10,(this->m_callbacks).m_user_data);
LAB_001bb8a3:
  iVar14 = basic_substring<const_char>::compare(&td->handle,'!');
  if (iVar14 != 0) {
    iVar14 = basic_substring<const_char>::compare(&td->handle,"!!",2);
    if (iVar14 != 0) {
      msg._0_16_ = (undefined1  [16])basic_substring<const_char>::trim(&td->handle,'!');
      chars.len = 0x40;
      chars.str = "01234567890abcdefghijklmnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ-";
      sVar15 = basic_substring<const_char>::first_not_of((basic_substring<const_char> *)msg,chars,0)
      ;
      if (sVar15 != 0xffffffffffffffff) {
        memcpy(msg,
               "check failed: (td.handle == \'!\' || td.handle == \"!!\" || td.handle.trim(\'!\').first_not_of(\"01234567890abcdefghijklmnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ-\") == npos)"
               ,0xa6);
        if (((byte)s_error_flags & 1) != 0) {
          bVar13 = is_debugger_attached();
          if (bVar13) {
            pcVar3 = (code *)swi(3);
            sVar15 = (*pcVar3)();
            return sVar15;
          }
        }
        p_Var2 = (this->m_callbacks).m_error;
        cVar16 = to_csubstr(
                           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                           );
        local_170 = cVar16.len;
        pcStack_178 = cVar16.str;
        LVar11.super_LineCol.col = 0;
        LVar11.super_LineCol.offset = SUB168(ZEXT816(0x6819) << 0x40,0);
        LVar11.super_LineCol.line = SUB168(ZEXT816(0x6819) << 0x40,8);
        LVar11.name.str = pcStack_178;
        LVar11.name.len = local_170;
        (*p_Var2)(msg,0xa6,LVar11,(this->m_callbacks).m_user_data);
      }
    }
  }
  sVar15 = num_tag_directives(this);
  if (3 < sVar15) {
    builtin_strncpy(msg + 0x10,"s < RYML_MAX_TAG_",0x11);
    builtin_strncpy(msg,"check failed: po",0x10);
    if (((byte)s_error_flags & 1) != 0) {
      bVar13 = is_debugger_attached();
      if (bVar13) {
        pcVar3 = (code *)swi(3);
        sVar15 = (*pcVar3)();
        return sVar15;
      }
    }
    p_Var2 = (this->m_callbacks).m_error;
    cVar16 = to_csubstr(
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                       );
    local_198 = cVar16.len;
    pcStack_1a0 = cVar16.str;
    LVar12.super_LineCol.col = 0;
    LVar12.super_LineCol.offset = SUB168(ZEXT816(0x681b) << 0x40,0);
    LVar12.super_LineCol.line = SUB168(ZEXT816(0x681b) << 0x40,8);
    LVar12.name.str = pcStack_1a0;
    LVar12.name.len = local_198;
    (*p_Var2)(msg,0x2c,LVar12,(this->m_callbacks).m_user_data);
  }
  this->m_tag_directives[sVar15].next_node_id = td->next_node_id;
  pcVar4 = (td->handle).str;
  sVar5 = (td->handle).len;
  sVar6 = (td->prefix).len;
  pcVar1 = &this->m_tag_directives[sVar15].prefix;
  pcVar1->str = (td->prefix).str;
  pcVar1->len = sVar6;
  this->m_tag_directives[sVar15].handle.str = pcVar4;
  this->m_tag_directives[sVar15].handle.len = sVar5;
  return sVar15;
}

Assistant:

size_t Tree::add_tag_directive(TagDirective const& td)
{
    _RYML_CB_CHECK(m_callbacks, !td.handle.empty());
    _RYML_CB_CHECK(m_callbacks, !td.prefix.empty());
    _RYML_CB_ASSERT(m_callbacks, td.handle.begins_with('!'));
    _RYML_CB_ASSERT(m_callbacks, td.handle.ends_with('!'));
    // https://yaml.org/spec/1.2.2/#rule-ns-word-char
    _RYML_CB_ASSERT(m_callbacks, td.handle == '!' || td.handle == "!!" || td.handle.trim('!').first_not_of("01234567890abcdefghijklmnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ-") == npos);
    size_t pos = num_tag_directives();
    _RYML_CB_CHECK(m_callbacks, pos < RYML_MAX_TAG_DIRECTIVES);
    m_tag_directives[pos] = td;
    return pos;
}